

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O0

void UnitTests::stream_any_details::output<char[2]>(ostream *s,char (*t) [2],true_type *param_3)

{
  true_type *param_2_local;
  char (*t_local) [2];
  ostream *s_local;
  
  std::operator<<(s,*t);
  return;
}

Assistant:

static void output(std::ostream& s, const T& t, const std::true_type& /*unused*/)
        {
            //  The optimiser will probably throw away the non taken branch
            //  In C++17 if constexpr would gaurantee that only the taken
            //  branch is compiled
            if (std::is_unsigned<T>::value)
                output_unsigned(s, t, 2 * sizeof t);
            else
                s << t;
        }